

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall cmComputeComponentGraph::~cmComputeComponentGraph(cmComputeComponentGraph *this)

{
  cmComputeComponentGraph *this_local;
  
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack(&this->TarjanStack);
  std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::~vector(&this->Components);
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::~vector(&this->TarjanEntries);
  std::vector<int,_std::allocator<int>_>::~vector(&this->TarjanComponents);
  std::vector<int,_std::allocator<int>_>::~vector(&this->TarjanVisited);
  cmGraphAdjacencyList::~cmGraphAdjacencyList(&this->ComponentGraph);
  return;
}

Assistant:

cmComputeComponentGraph::~cmComputeComponentGraph() = default;